

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::MergeNewHeapBlock(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                    *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>
                          *heapBlock)

{
  uint32 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->super_HeapBucket).sizeCat !=
      (uint)(heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
            super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
            super_SmallHeapBlockT<MediumAllocationBlockAttributes>.objectSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x646,"(heapBlock->GetObjectSize() == this->sizeCat)",
                       "heapBlock->GetObjectSize() == this->sizeCat");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  (heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
       (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->heapBlockList;
  this->heapBlockList = heapBlock;
  LOCK();
  puVar1 = &(this->super_HeapBucket).newHeapBlockCount;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  puVar1 = &(this->super_HeapBucket).heapBlockCount;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::MergeNewHeapBlock(TBlockType * heapBlock)
{
    Assert(heapBlock->GetObjectSize() == this->sizeCat);
    heapBlock->SetNextBlock(this->heapBlockList);
    this->heapBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    ::InterlockedDecrement(&this->newHeapBlockCount);
    this->heapBlockCount++;
#endif
}